

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O2

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::find(StringPiece *this,char c,size_type pos)

{
  ulong uVar1;
  char *pcVar2;
  void *pvVar3;
  
  uVar1 = this->length_;
  if ((pos <= uVar1 && uVar1 - pos != 0) && 0 < (long)uVar1) {
    pcVar2 = this->ptr_;
    pvVar3 = memchr(pcVar2 + pos,(int)c,uVar1 - pos);
    return -(ulong)(pvVar3 == (void *)0x0) | (long)pvVar3 - (long)pcVar2;
  }
  return -1;
}

Assistant:

stringpiece_ssize_type StringPiece::find(char c, size_type pos) const {
  if (length_ <= 0 || pos >= static_cast<size_type>(length_)) {
    return npos;
  }
  const char* result = static_cast<const char*>(
      memchr(ptr_ + pos, c, length_ - pos));
  return result != NULL ? result - ptr_ : npos;
}